

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O0

void format_default(format_list *pf,int redundant)

{
  uint local_1c;
  int local_18;
  png_uint_32 f;
  int i;
  int redundant_local;
  format_list *pf_local;
  
  if (redundant == 0) {
    for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
      if ((((local_1c & 2) != 0) || ((local_1c & 0x10) == 0)) &&
         (((local_1c & 1) != 0 || ((local_1c & 0x20) == 0)))) {
        format_set(pf,local_1c);
      }
    }
  }
  else {
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      pf->bits[local_18] = 0xffffffff;
    }
  }
  return;
}

Assistant:

static void format_default(format_list *pf, int redundant)
{
   if (redundant)
   {
      int i;

      /* set everything, including flags that are pointless */
      for (i=0; i<FORMAT_SET_COUNT; ++i)
         pf->bits[i] = ~(png_uint_32)0;
   }

   else
   {
      png_uint_32 f;

      for (f=0; f<FORMAT_COUNT; ++f)
      {
         /* Eliminate redundant and unsupported settings. */
#        ifdef PNG_FORMAT_BGR_SUPPORTED
            /* BGR is meaningless if no color: */
            if ((f & PNG_FORMAT_FLAG_COLOR) == 0 &&
               (f & PNG_FORMAT_FLAG_BGR) != 0)
#        else
            if ((f & 0x10U/*HACK: fixed value*/) != 0)
#        endif
            continue;

         /* AFIRST is meaningless if no alpha: */
#        ifdef PNG_FORMAT_AFIRST_SUPPORTED
            if ((f & PNG_FORMAT_FLAG_ALPHA) == 0 &&
               (f & PNG_FORMAT_FLAG_AFIRST) != 0)
#        else
            if ((f & 0x20U/*HACK: fixed value*/) != 0)
#        endif
            continue;

         format_set(pf, f);
      }
   }
}